

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::fea::Interp(ChVector<double> *__return_storage_ptr__,fea *this,ChVector<double> *v,
                   double *xi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ChVector<double> *in_RAX;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  
  dVar5 = (in_XMM0_Qa + 1.0) * 0.25;
  dVar6 = (1.0 - in_XMM0_Qa) * 0.25;
  dVar7 = dVar5 * (in_XMM1_Qa + 1.0);
  dVar8 = dVar6 * (in_XMM1_Qa + 1.0);
  dVar1 = *(double *)(this + 0x28);
  dVar2 = *(double *)(this + 0x10);
  dVar6 = dVar6 * (1.0 - in_XMM1_Qa);
  dVar3 = *(double *)(this + 0x40);
  dVar5 = dVar5 * (1.0 - in_XMM1_Qa);
  dVar4 = *(double *)(this + 0x58);
  dVar9 = *(double *)(this + 0x20);
  dVar10 = *(double *)(this + 0x38);
  dVar11 = *(double *)(this + 0x50);
  dVar12 = *(double *)(this + 8);
  __return_storage_ptr__->m_data[0] =
       dVar7 * *(double *)this + dVar8 * *(double *)(this + 0x18) + dVar6 * *(double *)(this + 0x30)
       + dVar5 * *(double *)(this + 0x48);
  __return_storage_ptr__->m_data[1] =
       dVar7 * dVar12 + dVar8 * dVar9 + dVar6 * dVar10 + dVar5 * dVar11;
  __return_storage_ptr__->m_data[2] = dVar7 * dVar2 + dVar8 * dVar1 + dVar6 * dVar3 + dVar5 * dVar4;
  return in_RAX;
}

Assistant:

static ChVector<> Interp(const ChVector<>* const v, const double xi[2]) {
    ChVector<> r = v[0] * L1(xi) + v[1] * L2(xi) + v[2] * L3(xi) + v[3] * L4(xi);
    return r;
}